

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O0

void output_features(io_buf *cache,uchar index,features *fs,uint64_t mask)

{
  bool bVar1;
  size_t sVar2;
  float **ppfVar3;
  features_value_index_iterator *this;
  ulong *puVar4;
  ulong uVar5;
  uint64_t uVar6;
  ulong i;
  feature_value *pfVar7;
  ulong in_RCX;
  int __c;
  v_array<float> *in_RDX;
  undefined1 in_SIL;
  features_value_iterator *rhs;
  io_buf *in_RDI;
  uint64_t diff;
  int64_t s_diff;
  feature_index fi;
  iterator *f_1;
  iterator __end1_1;
  iterator __begin1_1;
  features *__range1_1;
  uint64_t last;
  char *storage_size_loc;
  feature_value f;
  float *__end1;
  float *__begin1;
  v_array<float> *__range1;
  size_t storage;
  char *c;
  features_value_index_iterator *in_stack_ffffffffffffff50;
  features *in_stack_ffffffffffffff68;
  size_t in_stack_ffffffffffffff70;
  features_value_iterator in_stack_ffffffffffffff78;
  io_buf *in_stack_ffffffffffffff80;
  features_value_index_iterator local_78;
  v_array<float> *local_68;
  ulong local_60;
  long *local_58;
  float local_4c;
  float *local_48;
  float *local_40;
  v_array<float> *local_38;
  long local_30;
  features_value_index_iterator *local_28;
  ulong local_20;
  v_array<float> *local_18;
  undefined1 local_9;
  io_buf *local_8;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_9 = in_SIL;
  local_8 = in_RDI;
  sVar2 = features::size((features *)0x3b84a6);
  local_30 = sVar2 * 0xb;
  local_38 = local_18;
  ppfVar3 = v_array<float>::begin(local_18);
  local_40 = *ppfVar3;
  ppfVar3 = v_array<float>::end(local_38);
  local_48 = *ppfVar3;
  for (; local_40 != local_48; local_40 = local_40 + 1) {
    local_4c = *local_40;
    if (((local_4c != 1.0) || (NAN(local_4c))) && ((local_4c != -1.0 || (NAN(local_4c))))) {
      local_30 = local_30 + 4;
    }
  }
  io_buf::buf_write(in_stack_ffffffffffffff80,(char **)in_stack_ffffffffffffff78._begin,
                    in_stack_ffffffffffffff70);
  *(undefined1 *)local_28 = local_9;
  local_58 = (long *)((long)local_28 + 1);
  local_28 = (features_value_index_iterator *)((long)local_28 + 9);
  local_60 = 0;
  local_68 = local_18;
  features::begin(in_stack_ffffffffffffff68);
  features::end(in_stack_ffffffffffffff68);
  while( true ) {
    rhs = (features_value_iterator *)&stack0xffffffffffffff78;
    bVar1 = features_value_iterator::operator!=(&local_78.super_features_value_iterator,rhs);
    if (!bVar1) break;
    this = features_value_index_iterator::operator*(&local_78);
    puVar4 = (ulong *)features_value_index_iterator::index(this,(char *)rhs,__c);
    uVar5 = *puVar4 & local_20;
    uVar6 = ZigZagEncode(uVar5 - local_60);
    i = uVar6 << 2;
    local_60 = uVar5;
    pfVar7 = features_value_iterator::value(&this->super_features_value_iterator);
    if ((*pfVar7 != 1.0) || (NAN(*pfVar7))) {
      pfVar7 = features_value_iterator::value(&this->super_features_value_iterator);
      if ((*pfVar7 != -1.0) || (NAN(*pfVar7))) {
        in_stack_ffffffffffffff50 =
             (features_value_index_iterator *)run_len_encode((char *)local_28,i | 2);
        local_28 = in_stack_ffffffffffffff50;
        pfVar7 = features_value_iterator::value(&this->super_features_value_iterator);
        *(feature_value *)&(in_stack_ffffffffffffff50->super_features_value_iterator)._begin =
             *pfVar7;
        local_28 = (features_value_index_iterator *)
                   ((long)&(local_28->super_features_value_iterator)._begin + 4);
      }
      else {
        local_28 = (features_value_index_iterator *)run_len_encode((char *)local_28,i | 1);
      }
    }
    else {
      local_28 = (features_value_index_iterator *)run_len_encode((char *)local_28,i);
    }
    features_value_index_iterator::operator++(in_stack_ffffffffffffff50);
  }
  io_buf::set(local_8,(char *)local_28);
  *local_58 = (long)((long)local_28 + (-8 - (long)local_58));
  return;
}

Assistant:

void output_features(io_buf& cache, unsigned char index, features& fs, uint64_t mask)
{
  char* c;
  size_t storage = fs.size() * int_size;
  for (feature_value f : fs.values)
    if (f != 1. && f != -1.)
      storage += sizeof(feature_value);

  cache.buf_write(c, sizeof(index) + storage + sizeof(size_t));
  *reinterpret_cast<unsigned char*>(c) = index;
  c += sizeof(index);

  char* storage_size_loc = c;
  c += sizeof(size_t);

  uint64_t last = 0;
  for (features::iterator& f : fs)
  {
    feature_index fi = f.index() & mask;
    int64_t s_diff = (fi - last);
    uint64_t diff = ZigZagEncode(s_diff) << 2;
    last = fi;

    if (f.value() == 1.)
      c = run_len_encode(c, diff);
    else if (f.value() == -1.)
      c = run_len_encode(c, diff | neg_1);
    else
    {
      c = run_len_encode(c, diff | general);
      memcpy(c, &f.value(), sizeof(feature_value));
      c += sizeof(feature_value);
    }
  }

  cache.set(c);
  *(size_t*)storage_size_loc = c - storage_size_loc - sizeof(size_t);
}